

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

void printhex32(void *blob,int len)

{
  uint in_ESI;
  long in_RDI;
  int i;
  uint32_t *d;
  int local_1c;
  
  assert((in_ESI & 3) == 0);
  printf("{ ");
  local_1c = 0;
  while( true ) {
    if ((int)in_ESI / 4 <= local_1c) break;
    printf("0x%08x, ",(ulong)*(uint *)(in_RDI + (long)local_1c * 4),
           (long)(int)in_ESI % 4 & 0xffffffff);
    local_1c = local_1c + 1;
  }
  printf("}");
  return;
}

Assistant:

void printhex32 ( const void * blob, int len )
{
  assert((len & 3) == 0);

  uint32_t * d = (uint32_t*)blob;

  printf("{ ");

  for(int i = 0; i < len/4; i++)
  {
    printf("0x%08x, ",d[i]);
  }

  printf("}");
}